

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_delete_several_all(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  uint uVar3;
  int local_78;
  ion_byte_t value [10];
  ion_skiplist_t skiplist;
  
  initialize_skiplist_std_conditions(&skiplist);
  builtin_memcpy(value,"Wipe",5);
  for (local_78 = 9; local_78 < 99; local_78 = local_78 + 3) {
    iVar2 = sl_insert(&skiplist,&local_78,value);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.error == '\0'),0x492,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001034ba;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x493,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001034ba;
  }
  for (local_78 = 9; local_78 < 99; local_78 = local_78 + 3) {
    iVar2 = sl_delete(&skiplist,&local_78);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.error == '\0'),0x49e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001034ba;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x49f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001034ba;
  }
  uVar3 = (skiplist.head)->height;
  do {
    if ((int)uVar3 < 0) {
      sl_destroy(&skiplist);
      return;
    }
    pVar1 = planck_unit_assert_true
                      (tc,(uint)((skiplist.head)->next[uVar3] == (sl_node *)0x0),0x4ab,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    uVar3 = uVar3 - 1;
  } while (pVar1 != '\0');
LAB_001034ba:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_several_all(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t value[10];

	strcpy((char *) value, "Wipe");

	int i;

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** BEFORE **");
	print_skiplist(&skip_list);
#endif

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_delete(&skiplist, (ion_key_t) &i);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** AFTER **");
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t	*cursor = skiplist.head;
	ion_sl_level_t	h;

	for (h = cursor->height; h >= 0; h--) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cursor->next[h] == NULL);
	}

	sl_destroy(&skiplist);
}